

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O3

int Saig_ManSimDataInit2(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Aig_Obj_t *pObj;
  bool bVar4;
  Vec_Ptr_t *pVVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint *pInfo_2;
  ulong uVar13;
  uint uVar14;
  uint local_34;
  
  if (p->nRegs < 1) {
    local_34 = 0;
  }
  else {
    pVVar5 = p->vCis;
    local_34 = 0;
    do {
      uVar8 = p->nTruePis + local_34;
      if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) goto LAB_0061d55a;
      uVar9 = local_34 >> 5;
      uVar14 = local_34 & 0x1f;
      iVar12 = *(int *)((long)pVVar5->pArray[uVar8] + 0x24);
      if (((long)iVar12 < 0) || (vSimInfo->nSize <= iVar12)) goto LAB_0061d55a;
      local_34 = local_34 + 1;
      *(uint *)vSimInfo->pArray[iVar12] =
           *vSimInfo->pArray[iVar12] & 0xfffffffc |
           (uint)(((uint)(&pCex[1].iPo)[uVar9] >> uVar14 & 1) != 0);
    } while ((int)local_34 < p->nRegs);
  }
  if (pCex->iFrame < 0) {
    pVVar5 = p->vCos;
    uVar8 = pCex->iFrame;
  }
  else {
    uVar14 = 0;
    do {
      iVar12 = p->pConst1->Id;
      if (((long)iVar12 < 0) || (vSimInfo->nSize <= iVar12)) goto LAB_0061d55a;
      ppvVar2 = vSimInfo->pArray;
      pvVar3 = ppvVar2[iVar12];
      uVar13 = (ulong)(uVar14 >> 4);
      uVar8 = *(uint *)((long)pvVar3 + uVar13 * 4);
      bVar6 = (char)uVar14 * '\x02' & 0x1e;
      *(uint *)((long)pvVar3 + uVar13 * 4) = (uVar8 >> bVar6 & 3 ^ 1) << bVar6 ^ uVar8;
      if (0 < p->nTruePis) {
        pVVar5 = p->vCis;
        lVar10 = 0;
        do {
          if (pVVar5->nSize <= lVar10) goto LAB_0061d55a;
          uVar8 = local_34 + (int)lVar10;
          iVar12 = *(int *)((long)pVVar5->pArray[lVar10] + 0x24);
          if (((long)iVar12 < 0) || (vSimInfo->nSize <= iVar12)) goto LAB_0061d55a;
          pvVar3 = ppvVar2[iVar12];
          uVar9 = *(uint *)((long)pvVar3 + uVar13 * 4);
          *(uint *)((long)pvVar3 + uVar13 * 4) =
               (uVar9 >> bVar6 & 3 ^
               (uint)(((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0)) << bVar6
               ^ uVar9;
          lVar10 = lVar10 + 1;
        } while (lVar10 < p->nTruePis);
        local_34 = local_34 + (int)lVar10;
      }
      pVVar5 = p->vObjs;
      if (0 < pVVar5->nSize) {
        lVar10 = 0;
        do {
          pObj = (Aig_Obj_t *)pVVar5->pArray[lVar10];
          if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
            Saig_ManExtendOneEval2(vSimInfo,pObj,uVar14);
            pVVar5 = p->vObjs;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar5->nSize);
      }
      pVVar5 = p->vCos;
      if (0 < pVVar5->nSize) {
        lVar10 = 0;
        do {
          Saig_ManExtendOneEval2(vSimInfo,(Aig_Obj_t *)pVVar5->pArray[lVar10],uVar14);
          lVar10 = lVar10 + 1;
          pVVar5 = p->vCos;
        } while (lVar10 < pVVar5->nSize);
      }
      uVar8 = uVar14;
      if (uVar14 == pCex->iFrame) break;
      uVar8 = pCex->iFrame;
      if (0 < p->nRegs) {
        uVar11 = (ulong)(uVar14 + 1 >> 4);
        bVar7 = (char)uVar14 * '\x02' + 2U & 0x1e;
        iVar12 = 0;
        do {
          uVar8 = p->nTruePos + iVar12;
          if (((((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) ||
              (uVar9 = p->nTruePis + iVar12, (int)uVar9 < 0)) || (p->vCis->nSize <= (int)uVar9))
          goto LAB_0061d55a;
          iVar1 = *(int *)((long)pVVar5->pArray[uVar8] + 0x24);
          if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_0061d55a;
          uVar8 = *(uint *)((long)p->vCis->pArray[uVar9] + 0x24);
          if (((long)(int)uVar8 < 0) || ((uint)vSimInfo->nSize <= uVar8)) goto LAB_0061d55a;
          pvVar3 = vSimInfo->pArray[(int)uVar8];
          uVar8 = *(uint *)((long)pvVar3 + uVar11 * 4);
          *(uint *)((long)pvVar3 + uVar11 * 4) =
               ((uVar8 >> bVar7 ^ *(uint *)((long)vSimInfo->pArray[iVar1] + uVar13 * 4) >> bVar6) &
               3) << bVar7 ^ uVar8;
          iVar12 = iVar12 + 1;
        } while (iVar12 < p->nRegs);
        uVar8 = pCex->iFrame;
      }
      bVar4 = (int)uVar14 < (int)uVar8;
      uVar14 = uVar14 + 1;
    } while (bVar4);
  }
  iVar12 = pCex->iPo;
  if ((-1 < (long)iVar12) && (iVar12 < pVVar5->nSize)) {
    iVar12 = *(int *)((long)pVVar5->pArray[iVar12] + 0x24);
    if ((-1 < (long)iVar12) && (iVar12 < vSimInfo->nSize)) {
      return *(uint *)((long)vSimInfo->pArray[iVar12] + (long)((int)uVar8 >> 4) * 4) >>
             ((char)uVar8 * '\x02' & 0x1fU) & 3;
    }
  }
LAB_0061d55a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManSimDataInit2( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfo2Set( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfo2Set( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE_NEW );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfo2Set( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfo2Set( vSimInfo, pObjLo, f+1, Saig_ManSimInfo2Get(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfo2Get( vSimInfo, pObj, pCex->iFrame );
}